

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_shutdown_start(Curl_easy *data,int sockindex,int timeout_ms,curltime *nowp)

{
  curltime *pcVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  curltime cVar5;
  curltime local_28;
  
  if (nowp == (curltime *)0x0) {
    cVar5 = Curl_now();
    local_28.tv_sec = cVar5.tv_sec;
    local_28.tv_usec = cVar5.tv_usec;
    nowp = &local_28;
  }
  iVar3 = nowp->tv_usec;
  uVar4 = *(undefined4 *)&nowp->field_0xc;
  pcVar1 = (data->conn->shutdown).start + sockindex;
  pcVar1->tv_sec = nowp->tv_sec;
  pcVar1->tv_usec = iVar3;
  *(undefined4 *)&pcVar1->field_0xc = uVar4;
  if (timeout_ms < 1) {
    uVar2 = (data->set).shutdowntimeout;
    timeout_ms = 2000;
    if (uVar2 != 0) {
      timeout_ms = uVar2;
    }
  }
  (data->conn->shutdown).timeout_ms = timeout_ms;
  if (data->mid != 0) {
    Curl_expire_ex(data,nowp,(ulong)(uint)timeout_ms,EXPIRE_SHUTDOWN);
  }
  return;
}

Assistant:

void Curl_shutdown_start(struct Curl_easy *data, int sockindex,
                         int timeout_ms, struct curltime *nowp)
{
  struct curltime now;

  DEBUGASSERT(data->conn);
  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  data->conn->shutdown.start[sockindex] = *nowp;
  data->conn->shutdown.timeout_ms = (timeout_ms > 0) ?
    (unsigned int)timeout_ms :
    ((data->set.shutdowntimeout > 0) ?
     data->set.shutdowntimeout : DEFAULT_SHUTDOWN_TIMEOUT_MS);
  /* Set a timer, unless we operate on the admin handle */
  if(data->mid && data->conn->shutdown.timeout_ms)
    Curl_expire_ex(data, nowp, data->conn->shutdown.timeout_ms,
                   EXPIRE_SHUTDOWN);
}